

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::TraverseRec<tinyusdz::DistantLight>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathPrimMap<tinyusdz::DistantLight> *itemmap)

{
  size_type *psVar1;
  pointer pcVar2;
  vtable_type *pvVar3;
  pointer pPVar4;
  bool bVar5;
  uint32_t uVar6;
  undefined8 *puVar7;
  DistantLight *pDVar8;
  mapped_type *ppDVar9;
  ulong uVar10;
  undefined8 uVar11;
  Prim *child;
  pointer prim_00;
  string prim_abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_90;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (0x20000 < depth) {
    return false;
  }
  pcVar2 = (path_prefix->_M_dataplus)._M_p;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + path_prefix->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_50);
  Path::full_path_name_abi_cxx11_(&local_70,&prim->_path);
  uVar10 = 0xf;
  if (local_50 != local_40) {
    uVar10 = local_40[0];
  }
  if (uVar10 < local_70._M_string_length + local_48) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar11 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_48 <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_00310519;
    }
  }
  puVar7 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_00310519:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90.field_2._8_8_ = puVar7[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_90._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pvVar3 = (prim->_data).v_.vtable;
  if (((pvVar3 != (vtable_type *)0x0) && (uVar6 = (*pvVar3->type_id)(), uVar6 == 0x606)) &&
     (pDVar8 = tinyusdz::value::Value::as<tinyusdz::DistantLight>(&prim->_data,false),
     pDVar8 != (DistantLight *)0x0)) {
    ppDVar9 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::DistantLight_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::DistantLight_*>_>_>
              ::operator[](itemmap,&local_90);
    *ppDVar9 = pDVar8;
  }
  prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (prim_00 == pPVar4) {
    bVar5 = true;
  }
  else {
    do {
      bVar5 = TraverseRec<tinyusdz::DistantLight>(&local_90,prim_00,depth + 1,itemmap);
      if (!bVar5) break;
      prim_00 = prim_00 + 1;
    } while (prim_00 != pPVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool TraverseRec(const std::string &path_prefix, const tinyusdz::Prim &prim,
                 uint32_t depth, PathPrimMap<T> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  if (prim.is<T>()) {
    if (const T *pv = prim.as<T>()) {
      DCOUT("Path : <" << prim_abs_path << "> is " << tinyusdz::value::TypeTraits<T>::type_name());
      itemmap[prim_abs_path] = pv;
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}